

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_range.cpp
# Opt level: O2

ExprPtr __thiscall
mathiu::impl::functionRangeImpl(impl *this,ExprPtr *function,ExprPtr *symbol,ExprPtr *domain)

{
  InternalPatternT<matchit::impl::Id<mathiu::impl::Union>_> *pIVar1;
  anon_class_1_0_00000001 *paVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  IdProcess idProcess;
  ostream *poVar5;
  variant_alternative_t<1UL,_variant<monostate,_const_pair<pair<shared_ptr<const_Expr>,_bool>,_pair<shared_ptr<const_Expr>,_bool>_>_*,_const_SetOp_*,_const_Union_*,_bool>_>
  *value;
  variant_alternative_t<2UL,_variant<monostate,_const_pair<pair<shared_ptr<const_Expr>,_bool>,_pair<shared_ptr<const_Expr>,_bool>_>_*,_const_SetOp_*,_const_Union_*,_bool>_>
  *value_00;
  variant_alternative_t<3UL,_variant<monostate,_const_pair<pair<shared_ptr<const_Expr>,_bool>,_pair<shared_ptr<const_Expr>,_bool>_>_*,_const_SetOp_*,_const_Union_*,_bool>_>
  *value_01;
  Union *pUVar6;
  _Base_ptr p_Var7;
  logic_error *this_00;
  ExprPtr *ex;
  ExprPtr *ex_00;
  ExprPtr *ex_01;
  ExprPtr *ex_02;
  ExprPtr *ex_03;
  ExprPtr *ex_04;
  ExprPtr *ex_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar8;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> local_498;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> local_488;
  ContextT context;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_3d8;
  ExprPtr *local_3c8;
  ExprPtr *local_3c0;
  ExprPtr *local_3b8;
  App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>
  local_3b0;
  Id<mathiu::impl::Union> *local_328;
  ExprPtr *local_320;
  ExprPtr *local_318;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>
  local_310;
  App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
  local_2a0;
  App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>
  local_238;
  App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>
  local_1b0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  local_128;
  Id<mathiu::impl::Union> iUnion;
  App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
  local_98;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"functionRangeImpl: ");
  toString_abi_cxx11_((string *)&local_3b0,(impl *)function,ex);
  poVar5 = std::operator<<(poVar5,(string *)&local_3b0);
  poVar5 = std::operator<<(poVar5,",\t");
  toString_abi_cxx11_((string *)&local_1b0,(impl *)symbol,ex_00);
  poVar5 = std::operator<<(poVar5,(string *)&local_1b0);
  poVar5 = std::operator<<(poVar5,",\t");
  toString_abi_cxx11_((string *)&local_238,(impl *)domain,ex_01);
  poVar5 = std::operator<<(poVar5,(string *)&local_238);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  matchit::impl::Id<mathiu::impl::Union>::Id(&iUnion);
  paVar2 = (anon_class_1_0_00000001 *)
           (domain->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_3d8.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_3d8.mPattern = true;
  local_3c8 = function;
  local_3c0 = symbol;
  local_3b8 = domain;
  matchit::impl::Id<mathiu::impl::Union>::Id((Id<mathiu::impl::Union> *)&local_128,&iUnion);
  matchit::impl::as<mathiu::impl::Union>::{lambda(auto:1)#1}::operator()
            (&local_98,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Union>,
             (Id<mathiu::impl::Union> *)&local_128);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
  ::App(&local_2a0,&local_98);
  local_310.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
  ::App(&local_310.mPattern,&local_2a0);
  matchit::impl::
  App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>
  ::App((App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>
         *)&context,&local_310);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)((long)&local_310.mPattern.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>
                         + 8));
  local_238.mUnary =
       (AsPointer<mathiu::impl::SetOp> *)&matchit::impl::asPointer<mathiu::impl::SetOp>;
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
  ::And(&local_238.mPattern,
        (And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
         *)&context);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)((long)&context.mMemHolder._M_elems[1].
                                 super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
                                 .
                                 super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
                                 .
                                 super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
                                 .
                                 super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)((long)&local_2a0.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>,_false>
                         + 8));
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>
  ::App(&local_1b0,&local_238);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>
  ::App(&local_3b0,&local_1b0);
  local_498._M_ptr = (element_type *)0x0;
  local_498._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  context.mMemHolder._M_elems[5].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
           )0x0;
  context.mMemHolder._M_elems[5].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._M_index = '\0';
  context.mMemHolder._M_elems[5].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._9_7_ = 0;
  context.mMemHolder._M_elems[4].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
           )0x0;
  context.mMemHolder._M_elems[4].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._M_index = '\0';
  context.mMemHolder._M_elems[4].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._9_7_ = 0;
  context.mMemHolder._M_elems[3].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
           )0x0;
  context.mMemHolder._M_elems[3].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._M_index = '\0';
  context.mMemHolder._M_elems[3].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._9_7_ = 0;
  context.mMemHolder._M_elems[2].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
           )0x0;
  context.mMemHolder._M_elems[2].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._M_index = '\0';
  context.mMemHolder._M_elems[2].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._9_7_ = 0;
  context.mMemHolder._M_elems[1].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
           )0x0;
  context.mMemHolder._M_elems[1].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._M_index = '\0';
  context.mMemHolder._M_elems[1].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._9_7_ = 0;
  context.mMemHolder._M_elems[0].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
           )0x0;
  context.mMemHolder._M_elems[0].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._M_index = '\0';
  context.mMemHolder._M_elems[0].
  super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
  ._9_7_ = 0;
  context.mSize = 0;
  local_328 = &iUnion;
  local_320 = function;
  local_318 = symbol;
  matchit::impl::
  Context<const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool>
  ::Context(&context);
  local_310.mUnary = (anon_class_1_0_00000001 *)0x0;
  if (paVar2[0x38] == (anon_class_1_0_00000001)0x12) {
    local_310.mUnary = paVar2;
  }
  matchit::impl::
  Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>
  ::
  emplace_back<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*>
            ((Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>
              *)&context,
             (pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>
              **)&local_310);
  value = std::
          get<1ul,std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
                    ((variant<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
                      *)(&local_488 + context.mSize));
  bVar4 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*&,matchit::impl::Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>>
                    (value,&local_3d8,2,&context);
  if (bVar4) {
    functionRangeImplIntervalDomain((Interval *)&local_310,local_3c8,local_3c0,local_3b8);
    std::
    make_shared<mathiu::impl::Expr_const,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
              ((pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>
                *)&local_2a0);
    std::
    pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>
    ::~pair((pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>
             *)&local_310);
    std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_498,
               (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)&local_2a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2a0.mPattern);
  }
  else {
    context.mMemHolder._M_elems[5].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
             )0x0;
    context.mMemHolder._M_elems[5].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._M_index = '\0';
    context.mMemHolder._M_elems[5].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._9_7_ = 0;
    context.mMemHolder._M_elems[4].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
             )0x0;
    context.mMemHolder._M_elems[4].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._M_index = '\0';
    context.mMemHolder._M_elems[4].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._9_7_ = 0;
    context.mMemHolder._M_elems[3].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
             )0x0;
    context.mMemHolder._M_elems[3].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._M_index = '\0';
    context.mMemHolder._M_elems[3].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._9_7_ = 0;
    context.mMemHolder._M_elems[2].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
             )0x0;
    context.mMemHolder._M_elems[2].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._M_index = '\0';
    context.mMemHolder._M_elems[2].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._9_7_ = 0;
    context.mMemHolder._M_elems[1].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
             )0x0;
    context.mMemHolder._M_elems[1].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._M_index = '\0';
    context.mMemHolder._M_elems[1].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._9_7_ = 0;
    context.mMemHolder._M_elems[0].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
             )0x0;
    context.mMemHolder._M_elems[0].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._M_index = '\0';
    context.mMemHolder._M_elems[0].
    super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
    ._9_7_ = 0;
    context.mSize = 0;
    matchit::impl::
    Context<const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool>
    ::Context(&context);
    local_310.mUnary = (anon_class_1_0_00000001 *)0x0;
    if (paVar2[0x38] == (anon_class_1_0_00000001)0x16) {
      local_310.mUnary = paVar2;
    }
    matchit::impl::
    Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>
    ::emplace_back<mathiu::impl::SetOp_const*>
              ((Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>
                *)&context,(SetOp **)&local_310);
    value_00 = std::
               get<2ul,std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
                         ((variant<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
                           *)(&local_488 + context.mSize));
    bVar4 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<mathiu::impl::SetOp_const*&,matchit::impl::Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>>
                      (value_00,&local_3b0.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                                 .
                                 super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                                 ._M_head_impl,2,&context);
    if (bVar4) {
      local_310.mUnary = (anon_class_1_0_00000001 *)0x0;
      if (((anon_class_1_0_00000001 *)*value_00)[0x30].field_0x0 == '\0') {
        local_310.mUnary = (anon_class_1_0_00000001 *)*value_00;
      }
      matchit::impl::
      Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>
      ::emplace_back<mathiu::impl::Union_const*>
                ((Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>
                  *)&context,(Union **)&local_310);
      value_01 = std::
                 get<3ul,std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
                           ((variant<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
                             *)(&local_488 + context.mSize));
      bVar4 = matchit::impl::
              PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
              ::
              matchPatternImpl<mathiu::impl::Union_const*&,matchit::impl::Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>>
                        (value_01,(App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
                                   *)((long)&local_3b0.mPattern.mPatterns.
                                             super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                                             .
                                             super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                                             .
                                             super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>,_false>
                                     + 0x60),5,&context);
      if (bVar4) {
        pIVar1 = (InternalPatternT<matchit::impl::Id<mathiu::impl::Union>_> *)
                 ((long)&local_3b0.mPattern.mPatterns.
                         super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                         .
                         super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                         .
                         super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>,_false>
                 + 0x18);
        bVar4 = matchit::impl::
                matchPattern<mathiu::impl::Union_const&,matchit::impl::Id<mathiu::impl::Union>,matchit::impl::Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>>
                          (*value_01,pIVar1,6,&context);
        idProcess = (IdProcess)bVar4;
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                  (pIVar1,5,(uint)bVar4);
      }
      else {
        idProcess = kCANCEL;
      }
      pIVar1 = (InternalPatternT<matchit::impl::Id<mathiu::impl::Union>_> *)
               ((long)&local_3b0.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>,_false>
               + 0x18);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                (pIVar1,4,idProcess);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                (pIVar1,3,idProcess);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                (pIVar1,2,idProcess);
    }
    else {
      idProcess = kCANCEL;
    }
    pIVar1 = (InternalPatternT<matchit::impl::Id<mathiu::impl::Union>_> *)
             ((long)&local_3b0.mPattern.mPatterns.
                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>,_false>
             + 0x18);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
              (pIVar1,1,idProcess);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
              (pIVar1,0,idProcess);
    if (idProcess == kCANCEL) {
      context.mMemHolder._M_elems[5].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
               )0x0;
      context.mMemHolder._M_elems[5].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._M_index = '\0';
      context.mMemHolder._M_elems[5].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._9_7_ = 0;
      context.mMemHolder._M_elems[4].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
               )0x0;
      context.mMemHolder._M_elems[4].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._M_index = '\0';
      context.mMemHolder._M_elems[4].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._9_7_ = 0;
      context.mMemHolder._M_elems[3].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
               )0x0;
      context.mMemHolder._M_elems[3].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._M_index = '\0';
      context.mMemHolder._M_elems[3].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._9_7_ = 0;
      context.mMemHolder._M_elems[2].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
               )0x0;
      context.mMemHolder._M_elems[2].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._M_index = '\0';
      context.mMemHolder._M_elems[2].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._9_7_ = 0;
      context.mMemHolder._M_elems[1].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
               )0x0;
      context.mMemHolder._M_elems[1].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._M_index = '\0';
      context.mMemHolder._M_elems[1].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._9_7_ = 0;
      context.mMemHolder._M_elems[0].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._M_u = (_Variadic_union<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
               )0x0;
      context.mMemHolder._M_elems[0].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._M_index = '\0';
      context.mMemHolder._M_elems[0].
      super__Variant_base<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
      ._9_7_ = 0;
      context.mSize = 0;
      matchit::impl::
      Context<const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool>
      ::Context(&context);
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Mismatch in functionRangeImpl!");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_488,
               (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)false_);
    pUVar6 = matchit::impl::Id<mathiu::impl::Union>::get(local_328);
    for (p_Var7 = (pUVar6->super_ExprPtrSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(pUVar6->super_ExprPtrSet)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      functionRangeImpl((impl *)&local_2a0,local_320,local_318,(ExprPtr *)(p_Var7 + 1));
      union_((impl *)&local_310,(ExprPtr *)&local_488,(ExprPtr *)&local_2a0);
      std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_488,
                 (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)&local_310);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_310.mPattern);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2a0.mPattern);
    }
    std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_498,&local_488);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_488._M_refcount);
  }
  _Var3._M_pi = local_498._M_refcount._M_pi;
  local_498._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this = local_498._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var3._M_pi;
  local_498._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_498._M_refcount);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)((long)&local_3b0.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>,_false>
                         + 0x18));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)((long)&local_1b0.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>,_false>
                         + 0x18));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)((long)&local_238.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>,_false>
                         + 0x18));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)((long)&local_98.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage(&local_128);
  poVar5 = std::operator<<((ostream *)&std::cout,"functionRangeImpl: ");
  toString_abi_cxx11_((string *)&local_3b0,(impl *)function,ex_02);
  poVar5 = std::operator<<(poVar5,(string *)&local_3b0);
  poVar5 = std::operator<<(poVar5,",\t");
  toString_abi_cxx11_((string *)&local_1b0,(impl *)symbol,ex_03);
  poVar5 = std::operator<<(poVar5,(string *)&local_1b0);
  poVar5 = std::operator<<(poVar5,",\t");
  toString_abi_cxx11_((string *)&local_238,(impl *)domain,ex_04);
  poVar5 = std::operator<<(poVar5,(string *)&local_238);
  poVar5 = std::operator<<(poVar5,",\tresult: ");
  toString_abi_cxx11_((string *)&context,this,ex_05);
  poVar5 = std::operator<<(poVar5,(string *)&context);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&context);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)&iUnion);
  EVar8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr functionRangeImpl(ExprPtr const &function, ExprPtr const &symbol, ExprPtr const &domain)
    {
#if DEBUG
        std::cout << "functionRangeImpl: " << toString(function) << ",\t" << toString(symbol) << ",\t" << toString(domain) << std::endl;
#endif // DEBUG

        Id<Union> iUnion;
        auto result = match(*domain)(
            pattern | as<Interval>(_) = [&]
            { return makeSharedExprPtr(functionRangeImplIntervalDomain(function, symbol, domain)); },
            pattern | as<SetOp>(as<Union>(iUnion)) = [&]
            {
                ExprPtr result = false_;
                for (auto &&e : *iUnion)
                {
                    result = union_(result, functionRangeImpl(function, symbol, e));
                }
                return result;
            },
            pattern | _ = [&]
            {
                throw std::logic_error{"Mismatch in functionRangeImpl!"};
                return false_;
            });
#if DEBUG
        std::cout << "functionRangeImpl: " << toString(function) << ",\t" << toString(symbol) << ",\t" << toString(domain) << ",\tresult: " << toString(result) << std::endl;
#endif // DEBUG

        return result;
    }